

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

result_type __thiscall
math::wide_integer::uniform_int_distribution<32768u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<32768u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  uint *puVar1;
  uint *puVar2;
  value_type_conflict4 *pvVar3;
  unsigned_fast_type i;
  long lVar4;
  byte bVar5;
  sbyte sVar6;
  void *in_RCX;
  uint uVar9;
  ulong uVar7;
  byte bVar8;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  result_type range;
  uintwide_t<24U,_unsigned_char,_void,_false> result_max;
  uintwide_t<24U,_unsigned_char,_void,_false> local_4028 [1365];
  uintwide_t<24U,_unsigned_char,_void,_false> local_3028 [1365];
  uint local_2028 [1024];
  uint local_1028 [1024];
  
  uVar10 = 0;
  memset(this,0,0x1000);
  uVar9._0_3_ = input_params->param_a;
  uVar9._3_1_ = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  bVar8 = 1;
  lVar4 = 0;
  do {
    bVar5 = bVar8 - 1 & 3;
    if (bVar5 == 0) {
      uVar11 = (uVar9 % 0xadc8) * 0xbc8f;
      uVar10 = (uVar9 / 0xadc8) * 0xd47;
      uVar9 = (uVar9 / 0xadc8) * -0xd47;
      if (uVar11 < uVar10) {
        uVar9 = uVar10 ^ 0x7fffffff;
      }
      uVar9 = uVar9 + uVar11;
      *(uint *)input_params = uVar9;
      uVar10 = uVar9;
    }
    sVar6 = bVar5 << 3;
    *(uint *)(this + lVar4) = *(uint *)(this + lVar4) | (uVar10 >> sVar6 & 0xff) << sVar6;
    lVar4 = lVar4 + (ulong)((bVar8 & 3) == 0) * 4;
    bVar8 = bVar8 + 1;
  } while (lVar4 != 0x1000);
  memcpy(local_4028,in_RCX,0x1000);
  memset(local_3028,0,0x1000);
  lVar4 = 0xffc;
  do {
    bVar8 = 0;
    if (lVar4 == -4) break;
    uVar9 = *(uint *)(local_4028[0].values.super_array<unsigned_char,_3UL>.elems + lVar4);
    uVar10 = *(uint *)(local_3028[0].values.super_array<unsigned_char,_3UL>.elems + lVar4);
    bVar8 = -(uVar9 <= uVar10) | 1;
    lVar4 = lVar4 + -4;
  } while (uVar9 == uVar10);
  if (bVar8 == 0) {
    memcpy(local_2028,(void *)((long)in_RCX + 0x1000),0x1000);
    memset(local_1028,0,0x1000);
    memset(local_1028,0xff,0x1000);
    lVar4 = 0xffc;
    do {
      bVar8 = 0;
      if (lVar4 == -4) break;
      puVar1 = (uint *)((long)local_2028 + lVar4);
      puVar2 = (uint *)((long)local_1028 + lVar4);
      bVar8 = -(*puVar1 <= *puVar2) | 1;
      lVar4 = lVar4 + -4;
    } while (*puVar1 == *puVar2);
    if (bVar8 == 0) goto LAB_0015b1ba;
  }
  memcpy(local_4028,(void *)((long)in_RCX + 0x1000),0x1000);
  memcpy(local_2028,in_RCX,0x1000);
  lVar4 = 0;
  bVar12 = false;
  do {
    uVar7 = ((ulong)*(uint *)((long)local_4028 + lVar4 * 4) - (ulong)bVar12) -
            (ulong)local_2028[lVar4];
    *(int *)((long)local_4028 + lVar4 * 4) = (int)uVar7;
    bVar12 = uVar7 >> 0x20 != 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x400);
  memcpy((uniform_int_distribution<32768u,unsigned_int,void,false> *)local_3028,local_4028,0x1000);
  lVar4 = 0;
  do {
    pvVar3 = local_3028[0].values.super_array<unsigned_char,_3UL>.elems + lVar4;
    *(int *)pvVar3 = *(int *)pvVar3 + 1;
    if (*(int *)pvVar3 != 0) break;
    bVar12 = lVar4 != 0xffc;
    lVar4 = lVar4 + 4;
  } while (bVar12);
  if ((uniform_int_distribution<32768u,unsigned_int,void,false> *)local_3028 == this) {
    memset(this,0,0x1000);
  }
  else {
    memset(local_4028,0,0x1000);
    uintwide_t<32768U,_unsigned_int,_void,_false>::eval_divide_knuth
              ((uintwide_t<32768U,_unsigned_int,_void,_false> *)this,local_3028,local_4028);
    memcpy(this,local_4028,0x1000);
  }
  memcpy(local_4028,in_RCX,0x1000);
  uintwide_t<32768U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<32768U,_unsigned_int,_void,_false> *)this,local_4028);
LAB_0015b1ba:
  return (result_type)SUB83(this,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }